

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pvip_string.c
# Opt level: O1

PVIP_BOOL PVIP_string_concat(PVIPString *str,char *src,size_t len)

{
  size_t __size;
  char *pcVar1;
  ulong uVar2;
  
  uVar2 = str->len + len;
  if (str->buflen < uVar2) {
    __size = uVar2 * 2;
    str->buflen = __size;
    pcVar1 = (char *)realloc(str->buf,__size);
    str->buf = pcVar1;
    if (pcVar1 == (char *)0x0) {
      return 0;
    }
  }
  memcpy(str->buf + str->len,src,len);
  str->len = str->len + len;
  return 1;
}

Assistant:

PVIP_BOOL PVIP_string_concat(PVIPString *str, const char *src, size_t len) {
    if (str->len + len > str->buflen) {
        str->buflen = ( str->len + len ) * 2;
        str->buf    = realloc(str->buf, str->buflen);
        if (!str->buf) {
            return PVIP_FALSE;
        }
    }
    memcpy(str->buf + str->len, src, len);
    str->len += len;
    return PVIP_TRUE;
}